

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O3

uint32_t virtio_rx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  size_t size;
  uint *puVar1;
  long *plVar2;
  short sVar3;
  FILE *__stream;
  int iVar4;
  ulong in_RAX;
  undefined8 *puVar5;
  pkt_buf *ppVar6;
  ssize_t sVar7;
  void *__s;
  uint *puVar8;
  mempool *pmVar9;
  long lVar10;
  uint uVar11;
  long extraout_RDX;
  undefined8 unaff_RBP;
  ulong uVar12;
  ushort uVar13;
  undefined2 *puVar14;
  long lVar15;
  uint32_t uVar16;
  mempool *pmVar17;
  long lVar18;
  uint uVar19;
  ulong unaff_R13;
  ulong uVar20;
  ulong unaff_R15;
  dma_memory dVar21;
  ushort auStack_2f0 [256];
  mempool *pmStack_f0;
  void *pvStack_e8;
  ulong uStack_e0;
  ushort uStack_cc;
  ushort uStack_ca;
  undefined2 *puStack_c8;
  short sStack_ba;
  ulong uStack_b8;
  void *pvStack_b0;
  undefined4 uStack_a4;
  mempool *pmStack_a0;
  uint *puStack_98;
  ulong uStack_90;
  ulong uStack_80;
  code *pcStack_78;
  undefined2 uStack_62;
  ixy_device *piStack_60;
  uint *puStack_58;
  ulong uStack_50;
  ulong uStack_48;
  code *pcStack_40;
  undefined8 uStack_38;
  
  puVar8 = (uint *)ixy[1].driver_name;
  uStack_38 = in_RAX;
  if (num_bufs == 0) {
    uVar20 = 0;
  }
  else {
    uVar20 = 0;
    do {
      uVar13 = (ushort)puVar8[10];
      lVar10 = *(long *)(puVar8 + 6);
      if (uVar13 == *(ushort *)(lVar10 + 2)) goto LAB_00106bb9;
      uVar12 = (ulong)uVar13 % (ulong)*puVar8;
      uVar11 = *(uint *)(lVar10 + 4 + uVar12 * 8);
      *(ushort *)(puVar8 + 10) = uVar13 + 1;
      lVar18 = (ulong)uVar11 * 0x10;
      uVar13 = *(ushort *)(*(long *)(puVar8 + 2) + 0xc + lVar18);
      pmVar9 = (mempool *)(ulong)uVar13;
      if (uVar13 != 2) {
        pcStack_40 = (code *)0x106ca8;
        virtio_rx_batch_cold_1();
        goto LAB_00106ca8;
      }
      puVar5 = (undefined8 *)(*(long *)(puVar8 + 2) + lVar18);
      *puVar5 = 0;
      puVar5[1] = 0;
      ppVar6 = *(pkt_buf **)(puVar8 + (ulong)*(uint *)(lVar10 + 4 + uVar12 * 8) * 2 + 0xe);
      uVar11 = *(int *)(lVar10 + 8 + uVar12 * 8) - 10;
      ppVar6->size = uVar11;
      bufs[uVar20] = ppVar6;
      ixy[1].set_promisc = ixy[1].set_promisc + uVar11;
      ixy[1].tx_batch = ixy[1].tx_batch + 1;
      uVar20 = uVar20 + 1;
    } while (num_bufs != uVar20);
    uVar20 = (ulong)num_bufs;
  }
LAB_00106bb9:
  uVar11 = *puVar8;
  if (uVar11 != 0) {
    unaff_RBP = 0;
    unaff_R13 = 0;
    do {
      lVar10 = *(long *)(puVar8 + 2);
      unaff_R15 = unaff_R13 & 0xffff;
      if (*(long *)(lVar10 + (ulong)(uint)((int)unaff_R15 << 4)) == 0) {
        pmVar9 = *(mempool **)(puVar8 + 0xc);
        pcStack_40 = (code *)0x106bee;
        ppVar6 = pkt_buf_alloc(pmVar9);
        num_bufs = (uint32_t)lVar10;
        if (ppVar6 == (pkt_buf *)0x0) goto LAB_00106ca8;
        uVar12 = (ulong)(uint)((int)unaff_R15 << 4);
        uVar16 = *(uint32_t *)(*(long *)(puVar8 + 0xc) + 8);
        ppVar6->size = uVar16;
        ppVar6->head_room[0x26] = '\0';
        ppVar6->head_room[0x27] = '\0';
        ppVar6->head_room[0x1e] = '\0';
        ppVar6->head_room[0x1f] = '\0';
        ppVar6->head_room[0x20] = '*';
        ppVar6->head_room[0x21] = '\0';
        ppVar6->head_room[0x22] = '\0';
        ppVar6->head_room[0x23] = '\0';
        ppVar6->head_room[0x24] = '\0';
        ppVar6->head_room[0x25] = '\0';
        lVar10 = *(long *)(puVar8 + 2);
        *(uint32_t *)(lVar10 + 8 + uVar12) = uVar16 + 10;
        *(uintptr_t *)(lVar10 + uVar12) = ppVar6->buf_addr_phy + 0x36;
        *(undefined4 *)(lVar10 + 0xc + uVar12) = 2;
        *(pkt_buf **)(puVar8 + unaff_R15 * 2 + 0xe) = ppVar6;
        *(short *)(*(long *)(puVar8 + 4) + 4 +
                  ((ulong)*(ushort *)(*(long *)(puVar8 + 4) + 2) % (ulong)*puVar8) * 2) =
             (short)unaff_R13;
        num_bufs = 0x10;
        *(short *)(*(long *)(puVar8 + 4) + 2) = *(short *)(*(long *)(puVar8 + 4) + 2) + 1;
        pmVar9 = (mempool *)(ulong)*(uint *)&ixy[1].pci_addr;
        uStack_38 = uStack_38 & 0xffffffffffff;
        pcStack_40 = (code *)0x106c78;
        sVar7 = pwrite(*(uint *)&ixy[1].pci_addr,(void *)((long)&uStack_38 + 6),2,0x10);
        if (sVar7 != 2) goto LAB_00106cad;
        uVar11 = *puVar8;
      }
      uVar19 = (int)unaff_R13 + 1;
      unaff_R13 = (ulong)uVar19;
    } while ((uVar19 & 0xffff) < uVar11);
  }
  return (uint32_t)uVar20;
LAB_00106ca8:
  pcStack_40 = (code *)0x106cad;
  virtio_rx_batch_cold_3();
LAB_00106cad:
  pcStack_40 = virtio_tx_batch;
  virtio_rx_batch_cold_2();
  puVar1 = *(uint **)&pmVar9[5].buf_size;
  uVar12 = (ulong)num_bufs;
  piStack_60 = ixy;
  puStack_58 = puVar8;
  uStack_50 = uVar20;
  uStack_48 = unaff_R15;
  pcStack_40 = (code *)unaff_RBP;
  while( true ) {
    if ((ushort)puVar1[10] == *(ushort *)(*(long *)(puVar1 + 6) + 2)) break;
    uVar20 = (ulong)*(uint *)(*(long *)(puVar1 + 6) + 4 +
                             ((ulong)(ushort)puVar1[10] % (ulong)*puVar1) * 8);
    lVar10 = *(long *)(puVar1 + 2);
    lVar18 = uVar20 * 0x10;
    *(undefined8 *)(lVar10 + lVar18) = 0;
    *(undefined4 *)(lVar10 + 8 + lVar18) = 0;
    pcStack_78 = (code *)0x106d14;
    pkt_buf_free(*(pkt_buf **)(puVar1 + uVar20 * 2 + 0xe));
    *(short *)(puVar1 + 10) = (short)puVar1[10] + 1;
  }
  if (num_bufs == 0) {
    uVar20 = 0;
  }
  else {
    uVar11 = *puVar1;
    uVar20 = 0;
    uVar13 = 0;
    do {
      uVar19 = (uint)uVar13;
      if (uVar13 < uVar11) {
        lVar10 = *(long *)(*(long *)(puVar1 + 2) + (ulong)uVar13 * 0x10);
        while (lVar10 != 0) {
          uVar13 = uVar13 + 1;
          uVar19 = (uint)uVar13;
          if (uVar11 <= uVar13) break;
          lVar10 = *(long *)(*(long *)(puVar1 + 2) + (ulong)uVar13 * 0x10);
        }
      }
      if (uVar11 == uVar19) goto code_r0x00106dfb;
      plVar2 = *(long **)(extraout_RDX + uVar20 * 8);
      lVar18 = (ulong)uVar13 * 0x10;
      uVar11 = *(uint *)((long)plVar2 + 0x14);
      pmVar9[7].base_addr = (void *)((long)pmVar9[7].base_addr + (ulong)uVar11);
      *(long *)&pmVar9[6].buf_size = *(long *)&pmVar9[6].buf_size + 1;
      *(long **)(puVar1 + (ulong)uVar13 * 2 + 0xe) = plVar2;
      *(undefined2 *)((long)plVar2 + 0x3e) = 0;
      *(undefined8 *)((long)plVar2 + 0x36) = 0x2a0000;
      lVar10 = *(long *)(puVar1 + 2);
      *(uint *)(lVar10 + 8 + lVar18) = uVar11 + 10;
      *(long *)(lVar10 + lVar18) = *plVar2 + 0x36;
      *(undefined4 *)(lVar10 + 0xc + lVar18) = 0;
      uVar11 = *puVar1;
      iVar4 = (int)uVar20;
      uVar20 = uVar20 + 1;
      *(ushort *)
       (*(long *)(puVar1 + 4) + 4 +
       ((ulong)((uint)*(ushort *)(*(long *)(puVar1 + 4) + 2) + iVar4) % (ulong)uVar11) * 2) = uVar13
      ;
    } while (uVar20 != uVar12);
    uVar20 = (ulong)num_bufs;
  }
code_r0x00106dfb:
  puVar14 = &uStack_62;
  *(short *)(*(long *)(puVar1 + 4) + 2) = *(short *)(*(long *)(puVar1 + 4) + 2) + (short)uVar20;
  pmVar17 = (mempool *)(ulong)pmVar9[4].free_stack_top;
  uStack_62 = 1;
  pcStack_78 = (code *)0x106e24;
  sVar7 = pwrite(pmVar9[4].free_stack_top,puVar14,2,0x10);
  uVar11 = (uint)puVar14;
  if (sVar7 == 2) {
    return (uint32_t)uVar20;
  }
  pcStack_78 = virtio_legacy_setup_tx_queue;
  virtio_tx_batch_cold_1();
  sVar3 = (short)uVar11;
  pmStack_a0 = pmVar9;
  puStack_98 = puVar1;
  uStack_90 = unaff_R13;
  uStack_80 = uVar20;
  pcStack_78 = (code *)uVar12;
  if ((ushort)(sVar3 - 3U) < 0xfffe) {
    pmStack_f0 = (mempool *)0x10711a;
    virtio_legacy_setup_tx_queue_cold_5();
    uVar16 = (uint32_t)pmVar17;
LAB_0010711a:
    pmStack_f0 = (mempool *)0x10711f;
    virtio_legacy_setup_tx_queue_cold_1();
LAB_0010711f:
    pmStack_f0 = (mempool *)0x107124;
    virtio_legacy_setup_tx_queue_cold_2();
  }
  else {
    uVar16 = pmVar17[4].free_stack_top;
    pmStack_f0 = (mempool *)0x106e7c;
    sStack_ba = sVar3;
    sVar7 = pwrite(uVar16,&sStack_ba,2,0xe);
    pmVar9 = pmVar17;
    if (sVar7 != 2) goto LAB_0010711a;
    uVar16 = pmVar17[4].free_stack_top;
    pmStack_f0 = (mempool *)0x106e9d;
    sVar7 = pread(uVar16,&uStack_cc,2,0xc);
    if (sVar7 != 2) goto LAB_0010711f;
    pvStack_e8 = (void *)CONCAT44(pvStack_e8._4_4_,(uint)uStack_cc);
    pmStack_f0 = (mempool *)0x106ee1;
    uVar11 = fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of tx queue #%u: %u\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                     ,0x37,"virtio_legacy_setup_tx_queue",(ulong)(uVar11 & 0xffff));
    uVar20 = (ulong)uVar11;
    uVar11 = (uint)uStack_cc;
    if (uStack_cc == 0) goto LAB_00106ee6;
    uStack_b8 = (ulong)((uint)uStack_cc * 8);
    size = (ulong)(((uint)uStack_cc + (uint)uStack_cc * 8) * 2 + 0x1003 & 0x3ff000) + 4 + uStack_b8;
    pmStack_f0 = (mempool *)0x106f24;
    dVar21 = memory_allocate_dma(size,true);
    puStack_c8 = (undefined2 *)dVar21.phy;
    __s = dVar21.virt;
    pmStack_f0 = (mempool *)0x106f3c;
    memset(__s,0xab,size);
    pmStack_f0 = (mempool *)0x106f6d;
    pvStack_e8 = __s;
    pvStack_b0 = __s;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x3e,"virtio_legacy_setup_tx_queue",size);
    uVar16 = pmVar17[4].free_stack_top;
    uStack_a4 = (undefined4)((ulong)puStack_c8 >> 0xc);
    pmStack_f0 = (mempool *)0x106f8f;
    sVar7 = pwrite(uVar16,&uStack_a4,4,8);
    if (sVar7 == 4) {
      pmStack_f0 = (mempool *)0x106faf;
      puVar8 = (uint *)calloc(1,uStack_b8 + 0x38);
      *puVar8 = uVar11;
      __stream = _stderr;
      *(void **)(puVar8 + 2) = pvStack_b0;
      pvStack_e8 = (void *)((ulong)uStack_cc * 0x10 + (long)pvStack_b0);
      *(void **)(puVar8 + 4) = pvStack_e8;
      uStack_e0 = (long)pvStack_e8 + (ulong)uVar11 * 2 + 0x1003 & 0xfffffffffffff000;
      *(ulong *)(puVar8 + 6) = uStack_e0;
      pmStack_f0 = (mempool *)0x10700d;
      fprintf(__stream,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x44,"virtio_legacy_setup_tx_queue");
      uVar19 = *puVar8;
      puVar14 = *(undefined2 **)(puVar8 + 6);
      if ((ulong)uVar19 != 0) {
        lVar10 = *(long *)(puVar8 + 2);
        lVar18 = *(long *)(puVar8 + 4);
        lVar15 = 0;
        do {
          puVar5 = (undefined8 *)(lVar10 + lVar15 * 8);
          *puVar5 = 0;
          puVar5[1] = 0;
          *(undefined2 *)(lVar18 + 4 + lVar15) = 0;
          *(undefined8 *)(puVar14 + lVar15 * 2 + 2) = 0;
          lVar15 = lVar15 + 2;
        } while ((ulong)uVar19 * 2 != lVar15);
      }
      puVar14[1] = 0;
      puStack_c8 = *(undefined2 **)(puVar8 + 4);
      puStack_c8[1] = 0;
      *(undefined2 *)(puVar8 + 10) = 0;
      uVar16 = pmVar17[4].free_stack_top;
      pmStack_f0 = (mempool *)0x10707d;
      sVar7 = pread(uVar16,&uStack_ca,2,0x10);
      if (sVar7 != 2) goto LAB_00107129;
      pmStack_f0 = (mempool *)0x1070b7;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): vq notifcation offset %u\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x54,"virtio_legacy_setup_tx_queue",(ulong)uStack_ca);
      *(ulong *)(puVar8 + 8) = (ulong)uStack_ca;
      if (sVar3 == 2) {
        pmStack_f0 = (mempool *)0x1070d0;
        pmVar9 = memory_allocate_mempool(uVar11,0x800);
        *(mempool **)(puVar8 + 0xc) = pmVar9;
        **(undefined2 **)(puVar8 + 4) = 1;
        **(undefined2 **)(puVar8 + 6) = 0;
LAB_00107107:
        uVar20 = 0x88;
      }
      else {
        *puStack_c8 = 1;
        uVar20 = 0x80;
        *puVar14 = 0;
        if (sVar3 != 1) goto LAB_00107107;
      }
      *(uint **)((long)&pmVar17->base_addr + uVar20) = puVar8;
LAB_00106ee6:
      return (uint32_t)uVar20;
    }
  }
  pmStack_f0 = (mempool *)0x107129;
  virtio_legacy_setup_tx_queue_cold_3();
LAB_00107129:
  pmStack_f0 = (mempool *)0x10712e;
  virtio_legacy_setup_tx_queue_cold_4();
  pmStack_f0 = pmVar9;
  iVar4 = ioctl(uVar16,0x3b6c);
  if (iVar4 == -1) {
    vfio_enable_dma_cold_1();
  }
  else {
    auStack_2f0[0] = 0;
    sVar7 = pread(uVar16,auStack_2f0,2,4);
    if (sVar7 == 2) {
      auStack_2f0[0] = auStack_2f0[0] | 4;
      sVar7 = pwrite(uVar16,auStack_2f0,2,4);
      if (sVar7 == 2) {
        return 2;
      }
      __assert_fail("pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                    ,0x27,"void vfio_enable_dma(int)");
    }
  }
  __assert_fail("pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0x25,"void vfio_enable_dma(int)");
}

Assistant:

uint32_t virtio_rx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct virtio_device* dev = IXY_TO_VIRTIO(ixy);
	struct virtqueue* vq = dev->rx_queue;
	uint32_t buf_idx;

	_mm_mfence();
	// Retrieve used bufs from the device
	for (buf_idx = 0; buf_idx < num_bufs; ++buf_idx) {
		// Section 3.2.2
		if (vq->vq_used_last_idx == vq->vring.used->idx) {
			break;
		}
		// info("Rx packet: last used %u, used idx %u", vq->vq_used_last_idx,
		// vq->vring.used->idx);
		struct vring_used_elem* e = vq->vring.used->ring + (vq->vq_used_last_idx % vq->vring.num);
		// info("Used elem %p, id %u len %u", e, e->id, e->len);
		struct vring_desc* desc = &vq->vring.desc[e->id];
		vq->vq_used_last_idx++;
		// We don't support chaining or indirect descriptors
		if (desc->flags != VRING_DESC_F_WRITE) {
			error("unsupported rx flags on descriptor: %x", desc->flags);
		}
		// info("Desc %lu %u %u %u", desc->addr, desc->len, desc->flags,
		// desc->next);
		*desc = (struct vring_desc){};

		// Section 5.1.6.4
		struct pkt_buf* buf = vq->virtual_addresses[e->id];
		buf->size = e->len - sizeof(net_hdr);
		bufs[buf_idx] = buf;
		//struct virtio_net_hdr* hdr = (void*)(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr));

		// Update rx counter
		dev->rx_bytes += buf->size;
		dev->rx_pkts++;
	}
	// Fill empty slots in descriptor table
	for (uint16_t idx = 0; idx < vq->vring.num; ++idx) {
		struct vring_desc* desc = &vq->vring.desc[idx];
		if (desc->addr != 0) { // descriptor points to something, therefore it is in use
			continue;
		}
		// info("Found free desc slot at %u (%u)", idx, vq->vring.num);
		struct pkt_buf* buf = pkt_buf_alloc(vq->mempool);
		if (!buf) {
			error("failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small");
		}
		buf->size = vq->mempool->buf_size;
		memcpy(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr), &net_hdr, sizeof(net_hdr));
		vq->vring.desc[idx].len = buf->size + sizeof(net_hdr);
		vq->vring.desc[idx].addr =
			buf->buf_addr_phy + offsetof(struct pkt_buf, head_room) + sizeof(buf->head_room) - sizeof(net_hdr);
		vq->vring.desc[idx].flags = VRING_DESC_F_WRITE;
		vq->vring.desc[idx].next = 0;
		vq->virtual_addresses[idx] = buf;
		vq->vring.avail->ring[vq->vring.avail->idx % vq->vring.num] = idx;
		_mm_mfence(); // Make sure exposed descriptors reach device before index is updated
		vq->vring.avail->idx++;
		_mm_mfence(); // Make sure the index update reaches device before it is triggered
		virtio_legacy_notify_queue(dev, 0);
	}
	return buf_idx;
}